

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_monster_drop(parser *p)

{
  wchar_t tval;
  wchar_t sval;
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  object_kind *poVar4;
  undefined8 *puVar5;
  parser_error pVar6;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getsym(p,"tval");
    tval = tval_find_idx(pcVar3);
    if (tval < L'\0') {
      pVar6 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar3 = parser_getsym(p,"sval");
      sval = lookup_sval(tval,pcVar3);
      pVar6 = PARSE_ERROR_UNRECOGNISED_SVAL;
      if (L'\xffffffff' < sval) {
        uVar1 = parser_getuint(p,"min");
        pVar6 = PARSE_ERROR_INVALID_ITEM_NUMBER;
        if (uVar1 < 100) {
          uVar1 = parser_getuint(p,"max");
          if (uVar1 < 100) {
            poVar4 = lookup_kind(tval,sval);
            pVar6 = PARSE_ERROR_UNRECOGNISED_SVAL;
            if (poVar4 != (object_kind *)0x0) {
              puVar5 = (undefined8 *)mem_zalloc(0x20);
              puVar5[1] = poVar4;
              uVar1 = parser_getuint(p,"chance");
              *(uint *)((long)puVar5 + 0x14) = uVar1;
              uVar1 = parser_getuint(p,"min");
              *(uint *)(puVar5 + 3) = uVar1;
              uVar1 = parser_getuint(p,"max");
              *(uint *)((long)puVar5 + 0x1c) = uVar1;
              *puVar5 = *(undefined8 *)((long)pvVar2 + 0xa0);
              *(undefined8 **)((long)pvVar2 + 0xa0) = puVar5;
              pVar6 = PARSE_ERROR_NONE;
            }
          }
        }
      }
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_monster_drop(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_drop *d;
	struct object_kind *k;
	int tval, sval;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	if (parser_getuint(p, "min") > 99 || parser_getuint(p, "max") > 99)
		return PARSE_ERROR_INVALID_ITEM_NUMBER;

	k = lookup_kind(tval, sval);
	if (!k)
		return PARSE_ERROR_UNRECOGNISED_SVAL;
		
	d = mem_zalloc(sizeof *d);
	d->kind = k;
	d->percent_chance = parser_getuint(p, "chance");
	d->min = parser_getuint(p, "min");
	d->max = parser_getuint(p, "max");
	d->next = r->drops;
	r->drops = d;
	return PARSE_ERROR_NONE;
}